

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_SubD_ComponentIdTypeAndTag ON_SubD_ComponentIdTypeAndTag::CreateFromVertex(ON_SubDVertex *v)

{
  ulong uVar1;
  ulong uVar2;
  ON_SubDEdgeSharpness *pOVar3;
  ON_SubD_ComponentIdTypeAndTag OVar4;
  
  if (v == (ON_SubDVertex *)0x0) {
    uVar1._0_4_ = 0;
    uVar1._4_1_ = Unset;
    uVar1._5_1_ = '\0';
    uVar1._6_2_ = 0;
    pOVar3 = &Unset.m_sharpness;
  }
  else {
    uVar2 = (ulong)(v->super_ON_SubDComponentBase).m_id;
    uVar1 = (ulong)(v->m_vertex_tag & 7) << 0x28 | 0x200000000;
    if (uVar2 == 0) {
      uVar1 = 0;
    }
    uVar1 = uVar1 | uVar2;
    pOVar3 = &ON_SubDEdgeSharpness::Smooth;
  }
  OVar4.m_id = (int)uVar1;
  OVar4.m_type = (char)(uVar1 >> 0x20);
  OVar4.m_tag_and_dirx = (char)(uVar1 >> 0x28);
  OVar4.m_reserved = (short)(uVar1 >> 0x30);
  OVar4.m_sharpness.m_edge_sharpness =
       *&(((ON_SubD_ComponentIdTypeAndTag *)pOVar3)->m_sharpness).m_edge_sharpness;
  return OVar4;
}

Assistant:

const ON_SubD_ComponentIdTypeAndTag ON_SubD_ComponentIdTypeAndTag::CreateFromVertex(const ON_SubDVertex* v)
{
  ON_SubD_ComponentIdTypeAndTag itt
    = (nullptr != v)
    ? ON_SubD_ComponentIdTypeAndTag::CreateFromVertexId(v->m_id, v->m_vertex_tag)
    : ON_SubD_ComponentIdTypeAndTag::Unset;
  //if (itt.m_id > 0)
  //  itt.m_cptr = ON_SubDComponentPtr::Create(v);
  return itt;
}